

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O3

CordRep * __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeNavigator::
Init<(absl::lts_20240722::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtreeNavigator *this,CordRepBtree *tree)

{
  CordRepBtree *pCVar1;
  ulong uVar2;
  ulong uVar3;
  CordRepBtree CVar4;
  CordRepBtree CVar5;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xae,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  if (tree[0xf] == tree[0xe]) {
    __assert_fail("tree->size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xaf,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  CVar4 = tree[0xd];
  uVar3 = (ulong)(byte)CVar4;
  if (0xb < (byte)CVar4) {
    __assert_fail("tree->height() <= CordRepBtree::kMaxHeight",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xb0,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  this->height_ = (uint)(byte)CVar4;
  CVar5 = tree[0xe];
  this->node_[uVar3] = tree;
  *(CordRepBtree *)(this->index_ + uVar3) = CVar5;
  uVar2 = (ulong)(byte)CVar5;
  if (CVar4 != (CordRepBtree)0x0) {
    uVar3 = uVar3 + 1;
    CVar4 = tree[0xe];
    do {
      if ((byte)CVar5 < (byte)CVar4) goto LAB_002a5d95;
      if ((byte)tree[0xf] <= (byte)CVar5) goto LAB_002a5db4;
      tree = *(CordRepBtree **)(tree + uVar2 * 8 + 0x10);
      if (tree[0xc] != (CordRepBtree)0x3) {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      *(CordRepBtree **)(this->index_ + uVar3 * 8 + -4) = tree;
      CVar5 = tree[0xe];
      *(CordRepBtree *)(this->index_ + (uVar3 - 2)) = CVar5;
      uVar2 = (ulong)(byte)CVar5;
      uVar3 = uVar3 - 1;
      CVar4 = CVar5;
    } while (1 < uVar3);
  }
  pCVar1 = this->node_[0];
  if ((byte)pCVar1[0xe] <= (byte)CVar5) {
    if ((byte)CVar5 < (byte)pCVar1[0xf]) {
      return *(CordRep **)(pCVar1 + uVar2 * 8 + 0x10);
    }
LAB_002a5db4:
    __assert_fail("index < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
LAB_002a5d95:
  __assert_fail("index >= begin()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
}

Assistant:

inline CordRep* CordRepBtreeNavigator::Init(CordRepBtree* tree) {
  assert(tree != nullptr);
  assert(tree->size() > 0);
  assert(tree->height() <= CordRepBtree::kMaxHeight);
  int height = height_ = tree->height();
  size_t index = tree->index(edge_type);
  node_[height] = tree;
  index_[height] = static_cast<uint8_t>(index);
  while (--height >= 0) {
    tree = tree->Edge(index)->btree();
    node_[height] = tree;
    index = tree->index(edge_type);
    index_[height] = static_cast<uint8_t>(index);
  }
  return node_[0]->Edge(index);
}